

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

string * ExtractFilenameWithoutExt(string *__return_storage_ptr__,string *path)

{
  char *__s;
  long *local_48 [2];
  long local_38 [2];
  
  __s = (path->_M_dataplus)._M_p;
  strrchr(__s,0x2f);
  strrchr(__s,0x2e);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::substr((ulong)local_48,(ulong)path);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ExtractFilenameWithoutExt(const std::string& path) {
    size_t len = path.length();
    const char* cpath = path.c_str();
    const char* start = strrchr(cpath, PATH_DELIMITER);
    const char* end = strrchr(cpath, '.');

    if (end == nullptr) {
        end = &cpath[len];
    }
    if (start == nullptr) {
        start = &cpath[0];
    } else {
        start = start + 1;
    }

    std::string filename;
    size_t filename_len = end - start;
    size_t filename_start = start - cpath;
    filename = path.substr(filename_start, filename_len);

    return filename;
}